

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O0

void MPIX_step_recv(comm_pkg *comm,int tag,MPI_Comm mpi_comm,MPI_Datatype mpi_type,
                   MPI_Request *recv_requests,char **recv_buffer_ptr)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  ulong uVar1;
  long in_R8;
  undefined8 *in_R9;
  int i;
  int ctr;
  char *recv_buffer;
  int size;
  int end;
  int start;
  int proc;
  int local_50;
  int local_4c;
  void *local_48;
  int local_40;
  int local_3c;
  int local_38;
  undefined4 local_34;
  undefined8 *local_30;
  long local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_c;
  long local_8;
  
  local_48 = (void *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (*(int *)(*(long *)(in_RDI + 8) + 4) != 0) {
    MPI_Pack_size(*(undefined4 *)(*(long *)(in_RDI + 8) + 4),in_RCX,in_RDX,&local_40);
    uVar1 = (ulong)local_40;
    if ((long)uVar1 < 0) {
      uVar1 = 0xffffffffffffffff;
    }
    local_48 = operator_new__(uVar1);
  }
  local_4c = 0;
  for (local_50 = 0; local_50 < **(int **)(local_8 + 8); local_50 = local_50 + 1) {
    local_34 = *(undefined4 *)(*(long *)(*(long *)(local_8 + 8) + 8) + (long)local_50 * 4);
    local_38 = *(int *)(*(long *)(*(long *)(local_8 + 8) + 0x10) + (long)local_50 * 4);
    local_3c = *(int *)(*(long *)(*(long *)(local_8 + 8) + 0x10) + (long)(local_50 + 1) * 4);
    MPI_Pack_size(local_3c - local_38,local_20,local_18,&local_40);
    MPI_Irecv((long)local_48 + (long)local_4c,local_40,&ompi_mpi_packed,local_34,local_c,local_18,
              local_28 + (long)local_50 * 8);
    local_4c = local_40 + local_4c;
  }
  if (local_48 != (void *)0x0) {
    *local_30 = local_48;
  }
  return;
}

Assistant:

static void MPIX_step_recv(comm_pkg* comm,
        int tag, MPI_Comm mpi_comm, MPI_Datatype mpi_type,
        MPI_Request* recv_requests, char** recv_buffer_ptr)
{
    int proc, start, end, size;
    char* recv_buffer = NULL;
    if (comm->recv_data->size_msgs)
    {
        MPI_Pack_size(comm->recv_data->size_msgs, mpi_type, mpi_comm, &size);
        recv_buffer = new char[size];
    }

    int ctr = 0;
    for (int i = 0; i < comm->recv_data->num_msgs; i++)
    {
        proc = comm->recv_data->procs[i];
        start = comm->recv_data->indptr[i];
        end = comm->recv_data->indptr[i+1];
        MPI_Pack_size(end - start, mpi_type, mpi_comm, &size);
        MPI_Irecv(&recv_buffer[ctr], size, MPI_PACKED, proc, tag,
                mpi_comm, &recv_requests[i]);
        ctr += size;
    }

    if (recv_buffer) *recv_buffer_ptr = recv_buffer;
}